

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_short_(unsigned_short)>::PerformDefaultAction
          (FunctionMockerBase<unsigned_short_(unsigned_short)> *this,type args,
          string *call_description)

{
  Result RVar1;
  OnCallSpec<unsigned_short_(unsigned_short)> *this_00;
  Action<unsigned_short_(unsigned_short)> *this_01;
  string message;
  _Head_base<0UL,_unsigned_short,_false> local_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<unsigned_short_(unsigned_short)> *)0x0) {
    std::operator+(&local_30,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1 = DefaultValue<unsigned_short>::Get();
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    this_01 = OnCallSpec<unsigned_short_(unsigned_short)>::GetAction(this_00);
    local_32._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_short>).super__Head_base<0UL,_unsigned_short,_false>
         ._M_head_impl;
    RVar1 = Action<unsigned_short_(unsigned_short)>::Perform(this_01,(ArgumentTuple *)&local_32);
  }
  return RVar1;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }